

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O2

void __thiscall BitOutStream::crcCheck(BitOutStream *this,bool filled)

{
  pointer puVar1;
  pointer puVar2;
  uchar uVar3;
  uchar local_11;
  
  if (this->numCrcBytes == this->maxBuffer) {
    puVar1 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = CRC::Calculate<unsigned_char,(unsigned_short)8>
                      (puVar1,(long)(this->crcBuffer).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                       (Parameters<unsigned_char,_(unsigned_short)8> *)&CRC::CRC_8_LTE()::parameters
                      );
    if (uVar3 == '\0') {
      if (this->done == true) {
        this->crcFlag = false;
        puVar1 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        puVar1 = (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar1;
        }
        this->numCrcBytes = 0;
        this->nBitsDone = 0;
      }
      else {
        puVar1 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (!filled) {
          if (puVar2 != puVar1) {
            (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar1;
          }
          this->crcFlag = false;
          this->numCrcBytes = 0;
          this->nBitsDone = 0;
          fillBuffer(this);
          return;
        }
        if (puVar2 != puVar1) {
          (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        puVar1 = (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar1;
        }
        if (this->sync == 1) {
          this->numCrcBytes = 0;
          this->crcFlag = false;
        }
      }
    }
    else {
      this->failedSync = true;
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->crcBuffer,&local_11);
    this->numCrcBytes = this->numCrcBytes + 1;
    this->cByte = '\0';
    this->nBitsDone = 0;
    crcCheck(this,true);
  }
  return;
}

Assistant:

void BitOutStream::crcCheck(bool filled) {
    if (numCrcBytes == maxBuffer) {
        if (CRC::Calculate(crcBuffer.data(), crcBuffer.size() * sizeof(char), CRC::CRC_8_LTE()) != 0) {
            failedSync = true;
        } else if(done){
            crcFlag = false;
            crcBuffer.clear();
            wBuffer.clear();
            numCrcBytes = 0;
            nBitsDone = 0;
        } else if (filled) {
            crcBuffer.clear();
            wBuffer.clear();
            if (sync == 1) {
                numCrcBytes = 0;
                crcFlag = false;
            }
        } else {
            crcBuffer.clear();
            crcFlag = false;
            numCrcBytes = 0;
            nBitsDone = 0;
            fillBuffer();
        }
    } else {
        crcBuffer.push_back(static_cast<unsigned char>(cByte));
        numCrcBytes++;
        cByte = static_cast<unsigned char>(0);
        nBitsDone = 0;
        crcCheck(true);
    }
}